

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O0

vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> * __thiscall
QPDFPageDocumentHelper::getAllPages
          (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
           *__return_storage_ptr__,QPDFPageDocumentHelper *this)

{
  bool bVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  reference __args;
  QPDFObjectHandle *iter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  QPDFPageDocumentHelper *this_local;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *pages;
  
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::vector
            (__return_storage_ptr__);
  this_00 = QPDF::getAllPages((this->super_QPDFDocumentHelper).qpdf);
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(this_00);
  iter = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                     *)&iter), bVar1) {
    __args = __gnu_cxx::
             __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
             ::operator*(&__end1);
    std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
    emplace_back<QPDFObjectHandle_const&>
              ((vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>> *)
               __return_storage_ptr__,__args);
    __gnu_cxx::
    __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFPageObjectHelper>
QPDFPageDocumentHelper::getAllPages()
{
    std::vector<QPDFPageObjectHelper> pages;
    for (auto const& iter: this->qpdf.getAllPages()) {
        pages.emplace_back(iter);
    }
    return pages;
}